

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  CppType CVar1;
  int iVar2;
  Extension *pEVar3;
  LogMessage *pLVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExtensionSet *const_this;
  LogFinisher local_61;
  LogMessage local_60;
  MessageLite *pMVar5;
  
  pEVar3 = FindOrNull(this,number);
  if (pEVar3 == (Extension *)0x0) {
    pMVar5 = (MessageLite *)0x0;
  }
  else {
    if (pEVar3->is_repeated != false) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2f1);
      pLVar4 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (OPTIONAL_FIELD): "
                         );
      LogFinisher::operator=(&local_61,pLVar4);
      LogMessage::~LogMessage(&local_60);
    }
    CVar1 = anon_unknown_26::cpp_type(pEVar3->type);
    if (CVar1 != CPPTYPE_MESSAGE) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x2f1);
      pLVar4 = LogMessage::operator<<
                         (&local_60,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_61,pLVar4);
      LogMessage::~LogMessage(&local_60);
    }
    if ((pEVar3->field_0xa & 0x10) == 0) {
      pMVar5 = (pEVar3->field_0).message_value;
      if (this->arena_ != (Arena *)0x0) {
        iVar2 = (*pMVar5->_vptr_MessageLite[3])(pMVar5,0);
        pMVar5 = (MessageLite *)CONCAT44(extraout_var,iVar2);
        (*pMVar5->_vptr_MessageLite[7])(pMVar5,(pEVar3->field_0).int64_t_value);
      }
    }
    else {
      iVar2 = (*((pEVar3->field_0).message_value)->_vptr_MessageLite[7])
                        ((pEVar3->field_0).message_value,prototype,this->arena_);
      pMVar5 = (MessageLite *)CONCAT44(extraout_var_00,iVar2);
      if ((this->arena_ == (Arena *)0x0) && ((pEVar3->field_0).message_value != (MessageLite *)0x0))
      {
        (*((pEVar3->field_0).message_value)->_vptr_MessageLite[1])();
      }
    }
    Erase(this,number);
  }
  return pMVar5;
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(int number,
                                          const MessageLite& prototype) {
  Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return nullptr.
    return nullptr;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    MessageLite* ret = nullptr;
    if (extension->is_lazy) {
      ret = extension->lazymessage_value->ReleaseMessage(prototype, arena_);
      if (arena_ == nullptr) {
        delete extension->lazymessage_value;
      }
    } else {
      if (arena_ == nullptr) {
        ret = extension->message_value;
      } else {
        // ReleaseMessage() always returns a heap-allocated message, and we are
        // on an arena, so we need to make a copy of this message to return.
        ret = extension->message_value->New();
        ret->CheckTypeAndMergeFrom(*extension->message_value);
      }
    }
    Erase(number);
    return ret;
  }
}